

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.c
# Opt level: O3

void rhash_init_algorithms(uint mask)

{
  rhash_uninitialized_algorithms = 0;
  return;
}

Assistant:

void rhash_init_algorithms(unsigned mask)
{
	(void)mask; /* unused now */

	/* verify that RHASH_HASH_COUNT is the index of the major bit of RHASH_ALL_HASHES */
	assert(1 == (RHASH_ALL_HASHES >> (RHASH_HASH_COUNT - 1)));

#ifdef GENERATE_GOST94_LOOKUP_TABLE
	rhash_gost94_init_table();
#endif
	rhash_uninitialized_algorithms = 0;
}